

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# First.hpp
# Opt level: O2

OUT * __thiscall
linq::
First<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
          *source)

{
  char cVar1;
  out_of_range *this_00;
  
  (*(code *)**(undefined8 **)this)(this);
  cVar1 = (**(code **)(*(long *)this + 8))(this);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this + 0x18))(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"this");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

auto First(S&& source)
	{
		source.Init();

		if(!source.Valid())
			throw std::out_of_range("this");

		return source.Current();
	}